

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

BasicBlock * __thiscall IR::IRBuilder::newBasicBlock(IRBuilder *this)

{
  reference pvVar1;
  IRBuilder *this_local;
  
  std::forward_list<IR::BasicBlock,std::allocator<IR::BasicBlock>>::emplace_front<IR::Function*&>
            ((forward_list<IR::BasicBlock,std::allocator<IR::BasicBlock>> *)
             &this->function_->blocks_,&this->function_);
  pvVar1 = std::forward_list<IR::BasicBlock,_std::allocator<IR::BasicBlock>_>::front
                     (&this->function_->blocks_);
  return pvVar1;
}

Assistant:

BasicBlock* IRBuilder::newBasicBlock() {
  function_->blocks_.emplace_front(function_);
  return &function_->blocks_.front();
}